

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<(anonymous_namespace)::ns::Project<std::vector<(anonymous_namespace)::ns::Value,std::allocator<(anonymous_namespace)::ns::Value>>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  bool bVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  _Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  *this_01;
  pointer __result;
  iterator this_02;
  conv_error *pcVar2;
  error_category *peVar3;
  _Tp_alloc_type *__alloc;
  string_view_type *key;
  const_array_range_type cVar4;
  error_code ec;
  error_code ec_00;
  type local_88;
  vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  local_58;
  string_view_type local_40;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar1) {
    pcVar2 = (conv_error *)__cxa_allocate_exception(0x58);
    peVar3 = conv_error_category();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Not a ns::Project",(allocator<char> *)&local_58);
    ec._M_cat = peVar3;
    ec._0_8_ = 1;
    conv_error::conv_error(pcVar2,ec,&local_88.name);
    __cxa_throw(pcVar2,&conv_error::typeinfo,conv_error::~conv_error);
  }
  __return_storage_ptr__->version = 1;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->author)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->author).field_2;
  (__return_storage_ptr__->author)._M_string_length = 0;
  (__return_storage_ptr__->author).field_2._M_local_buf[0] = '\0';
  __alloc = (_Tp_alloc_type *)&(__return_storage_ptr__->notes).field_2;
  (__return_storage_ptr__->notes)._M_dataplus._M_p = (pointer)__alloc;
  (__return_storage_ptr__->notes)._M_string_length = 0;
  (__return_storage_ptr__->notes).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->showNotes = false;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.name._M_dataplus._M_p = (pointer)0x7;
  local_88.name._M_string_length = 0x72ebeb;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = (pointer)0x7;
    local_88.name._M_string_length = 0x72ebeb;
    json_traits_helper<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::set_udt_member<int>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->version);
  }
  local_88.name._M_dataplus._M_p = (pointer)0x4;
  local_88.name._M_string_length = 0x7b451f;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = (pointer)0x4;
    local_88.name._M_string_length = 0x7b451f;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->name);
  }
  local_88.name._M_dataplus._M_p = &DAT_00000006;
  local_88.name._M_string_length = 0x73d32e;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = &DAT_00000006;
    local_88.name._M_string_length = 0x73d32e;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->author);
  }
  local_88.name._M_dataplus._M_p = &DAT_00000005;
  local_88.name._M_string_length = 0x78e0c4;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = &DAT_00000005;
    local_88.name._M_string_length = 0x78e0c4;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->notes);
  }
  local_88.name._M_dataplus._M_p = (pointer)0x9;
  local_88.name._M_string_length = 0x78e0ca;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = (pointer)0x9;
    local_88.name._M_string_length = 0x78e0ca;
    json_traits_helper<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::set_udt_member<bool>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->showNotes);
  }
  local_88.name._M_dataplus._M_p = &DAT_00000006;
  local_88.name._M_string_length = 0x6bd8bb;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    key = &local_40;
    local_40._M_len = 6;
    local_40._M_str = "values";
    this_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                         key);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(this_00);
    if (!bVar1) {
      pcVar2 = (conv_error *)__cxa_allocate_exception(0x58);
      peVar3 = conv_error_category();
      ec_00._M_cat = peVar3;
      ec_00._0_8_ = 4;
      conv_error::conv_error(pcVar2,ec_00);
      __cxa_throw(pcVar2,&conv_error::typeinfo,conv_error::~conv_error);
    }
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = (_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
    if ((_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         *)0x333333333333333 < this_01) {
      std::__throw_length_error("vector::reserve");
    }
    if (this_01 !=
        (_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         *)0x0) {
      __result = std::
                 _Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                 ::_M_allocate(this_01,(size_t)key);
      std::
      vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>::
      _S_relocate((pointer)0x0,(pointer)0x0,__result,__alloc);
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_01;
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_finish = __result;
    }
    cVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this_00);
    for (this_02 = cVar4.first_._M_current; this_02._M_current != cVar4.last_._M_current._M_current;
        this_02._M_current = this_02._M_current + 1) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
      as<(anonymous_namespace)::ns::Value>(&local_88,this_02._M_current);
      std::
      vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>::
      push_back(&local_58,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    local_88.name.field_2._M_allocated_capacity =
         (size_type)
         (__return_storage_ptr__->values).
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.name._M_dataplus._M_p =
         (pointer)(__return_storage_ptr__->values).
                  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_88.name._M_string_length =
         (size_type)
         (__return_storage_ptr__->values).
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::~vector((vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               *)&local_88);
    std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }